

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001a9e80 = 0x2d2d2d2d2d2d2d;
    uRam00000000001a9e87 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001a9e70 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001a9e78 = 0x2d2d2d2d2d2d2d;
    DAT_001a9e7f = 0x2d;
    _DAT_001a9e60 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001a9e68 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001a9e50 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001a9e58 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001a9e48 = 0x2d2d2d2d2d2d2d2d;
    DAT_001a9e8f = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}